

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderMaxPatchVertices::iterate(TessellationShaderMaxPatchVertices *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  uint uVar7;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLfloat inner [2];
  GLfloat outer [4];
  long lVar8;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)outer,"Tessellation shader functionality not supported, skipping",
               (allocator<char> *)inner);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)outer);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  initTest(this);
  (**(code **)(lVar8 + 0x1680))(this->m_po_id_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glUseProgram() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2fc);
  (**(code **)(lVar8 + 0x5e0))(0x8c89);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEnable(RASTERIZER_DISCARD) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x2ff);
  (**(code **)(lVar8 + 0xd0))(0x8e22,this->m_tf_id_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindTransformFeedback() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x302);
  (**(code **)(lVar8 + 0x48))(0x8c8e,0,this->m_bo_id_f_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBufferRange() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x305);
  (**(code **)(lVar8 + 0x48))(0x8c8e,1,this->m_bo_id_i_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBufferRange() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x308);
  (**(code **)(lVar8 + 0x30))(0);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBeginTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x30c);
  (**(code **)(lVar8 + 0x538))
            ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,this->m_gl_max_patch_vertices);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x30f);
  (**(code **)(lVar8 + 0x638))();
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x312);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_bo_id_f_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x318);
  bVar1 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_fv_case_1);
  (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_bo_id_i_1);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x31e);
  bVar2 = compareResults(this,"Case 1 (explicit arrays)",this->m_ref_iv_case_1);
  uVar7 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  if ((uVar7 & 0x300) == 0) {
    if (!bVar2 || !bVar1) {
      return STOP;
    }
  }
  else {
    (**(code **)(lVar8 + 0x1680))(this->m_po_id_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x329);
    (**(code **)(lVar8 + 0xd0))(0x8e22,this->m_tf_id_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindTransformFeedback() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x32c);
    (**(code **)(lVar8 + 0x48))(0x8c8e,0,this->m_bo_id_f_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x32f);
    (**(code **)(lVar8 + 0x48))(0x8c8e,1,this->m_bo_id_i_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBufferRange() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x332);
    inner[0] = 1.0;
    inner[1] = 1.0;
    outer[0] = 1.0;
    outer[1] = 1.0;
    outer[2] = 1.0;
    outer[3] = 1.0;
    (**(code **)(lVar8 + 0xfd0))(0x8e74);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glPatchParameterfv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x339);
    (**(code **)(lVar8 + 0xfd0))(0x8e73,inner);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glPatchParameterfv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x33c);
    (**(code **)(lVar8 + 0x30))(0);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBeginTransformFeedback(GL_POINTS) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x340);
    (**(code **)(lVar8 + 0x538))(0xe,0,this->m_gl_max_patch_vertices);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glDrawArrays() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x343);
    (**(code **)(lVar8 + 0x638))();
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x346);
    (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_bo_id_f_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x34a);
    bVar3 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_fv_case_2);
    (**(code **)(lVar8 + 0x40))(0x8c8e,this->m_bo_id_i_2);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                    ,0x350);
    bVar4 = compareResults(this,"Case 2 (implicit arrays)",this->m_ref_iv_case_2);
    if ((!bVar2 || !bVar1) || (!bVar4 || !bVar3)) {
      return STOP;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderMaxPatchVertices::iterate(void)
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialization */
	initTest();

	/* Render setup case 1. */
	gl.useProgram(m_po_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(RASTERIZER_DISCARD) failed!");

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

	/* Rendering case 1 with transform feedback.*/
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");

	gl.drawArrays(m_glExtTokens.PATCHES, 0, m_gl_max_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Compare vec4 results from transform feedback for case 1. */
	bool test_passed = true;

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_fv_case_1);

	/* Compare ivec4 results from transform feedback for case 2. */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	test_passed &= compareResults("Case 1 (explicit arrays)", m_ref_iv_case_1);

	// Case 2 tests with no TCS (default TCS is expected to be used).
	// Since this is not allowed by ES 3.1, just skip it.
	// Leaving the code for Desktop
	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Set up rendering for case 2. */
		gl.useProgram(m_po_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed!");

		gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_tf_id_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1 /* index */, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() failed!");

		/* Tessellation Control Levels setup. */
		const glw::GLfloat inner[] = { 1.0, 1.0 };
		const glw::GLfloat outer[] = { 1.0, 1.0, 1.0, 1.0 };

		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, outer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, inner);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameterfv() failed!");

		/* Rendering case 2 with transform feedback. */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) failed");

		gl.drawArrays(GL_PATCHES, 0, m_gl_max_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Compare vec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_f_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_fv_case_2);

		/* Compare ivec4 results from transform feedback for case 2. */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id_i_2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

		test_passed &= compareResults("Case 2 (implicit arrays)", m_ref_iv_case_2);
	}
	/* All done */
	if (test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	return STOP;
}